

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O0

Point2f pbrt::RejectionSampleDisk(RNG *rng)

{
  undefined1 auVar1 [16];
  Tuple2<pbrt::Point2,_float> TVar2;
  RNG *in_RDI;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  Point2f p;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  Point2<float>::Point2((Point2<float> *)in_RDI);
  do {
    auVar5._0_4_ = RNG::Uniform<float>(in_RDI);
    auVar5._4_60_ = extraout_var;
    auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar5._0_16_,
                             SUB6416(ZEXT464(0x3f800000),0));
    fVar3 = auVar1._0_4_;
    auVar6._0_4_ = RNG::Uniform<float>(in_RDI);
    auVar6._4_60_ = extraout_var_00;
    auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar6._0_16_,
                             SUB6416(ZEXT464(0x3f800000),0));
    fVar4 = auVar1._0_4_;
    auVar1 = vfmadd213ss_fma(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),
                             ZEXT416((uint)(fVar4 * fVar4)));
  } while (1.0 < auVar1._0_4_);
  TVar2.y = fVar4;
  TVar2.x = fVar3;
  return (Point2f)TVar2;
}

Assistant:

Point2f RejectionSampleDisk(RNG &rng) {
    Point2f p;
    do {
        p.x = 1 - 2 * rng.Uniform<Float>();
        p.y = 1 - 2 * rng.Uniform<Float>();
    } while (p.x * p.x + p.y * p.y > 1);
    return p;
}